

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
srell::
regex_replace<srell::u8regex_traits<char>,char,std::char_traits<char>,std::allocator<char>,std::char_traits<char>,std::allocator<char>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,srell *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
          basic_regex<char,_srell::u8regex_traits<char>_> *e,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fmt,
          match_flag_type flags)

{
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last;
  match_flag_type flags_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fmt_local;
  basic_regex<char,_srell::u8regex_traits<char>_> *e_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  out = std::back_inserter<std::__cxx11::string>(__return_storage_ptr__);
  first._M_current = (char *)std::__cxx11::string::begin();
  last._M_current = (char *)std::__cxx11::string::end();
  regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,srell::u8regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (out,first,last,(basic_regex<char,_srell::u8regex_traits<char>_> *)s,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)e,
             (match_flag_type)fmt);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<charT, ST, SA> regex_replace(
	const std::basic_string<charT, ST, SA> &s,
	const basic_regex<charT, traits> &e,
	const std::basic_string<charT, FST, FSA> &fmt,
	const regex_constants::match_flag_type flags = regex_constants::match_default
)
{
	std::basic_string<charT, ST, SA> result;

	regex_replace(std::back_inserter(result), s.begin(), s.end(), e, fmt, flags);
	return result;
}